

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.hpp
# Opt level: O3

void __thiscall ClipperLib::PolyTree::~PolyTree(PolyTree *this)

{
  pointer ppPVar1;
  
  (this->super_PolyNode)._vptr_PolyNode = (_func_int **)&PTR__PolyTree_00123d78;
  Clear(this);
  ppPVar1 = (this->AllNodes).
            super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppPVar1 != (pointer)0x0) {
    operator_delete(ppPVar1,(long)(this->AllNodes).
                                  super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppPVar1
                   );
  }
  PolyNode::~PolyNode(&this->super_PolyNode);
  return;
}

Assistant:

~PolyTree(){ Clear(); }